

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O0

int __thiscall IPAsirMiniSAT::solve(IPAsirMiniSAT *this,bool simp)

{
  bool bVar1;
  byte in_SIL;
  SimpSolver *in_RDI;
  lbool res;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  lbool b;
  int iVar2;
  lbool local_d;
  lbool local_c;
  lbool local_b;
  lbool local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  *(long *)&in_RDI[1].super_Solver.status_every = *(long *)&in_RDI[1].super_Solver.status_every + 1;
  reset((IPAsirMiniSAT *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  local_a = Minisat::SimpSolver::solveLimited
                      (in_RDI,(vec<Minisat::Lit> *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       (bool)in_stack_ffffffffffffffdf,(bool)in_stack_ffffffffffffffde);
  Minisat::vec<Minisat::Lit>::clear
            ((vec<Minisat::Lit> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (bool)in_stack_ffffffffffffffdf);
  b.value = (uint8_t)((uint)in_stack_ffffffffffffffe4 >> 0x18);
  Minisat::lbool::lbool(&local_b,'\0');
  bVar1 = Minisat::lbool::operator!=
                    ((lbool *)CONCAT17(in_stack_ffffffffffffffdf,
                                       CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)
                                      ),b);
  in_RDI[1].super_Solver.reparsed_options = bVar1;
  Minisat::lbool::lbool(&local_c,'\x02');
  bVar1 = Minisat::lbool::operator==(&local_a,local_c);
  if (bVar1) {
    iVar2 = 0;
  }
  else {
    Minisat::lbool::lbool(&local_d,'\0');
    bVar1 = Minisat::lbool::operator==(&local_a,local_d);
    iVar2 = 0x14;
    if (bVar1) {
      iVar2 = 10;
    }
  }
  return iVar2;
}

Assistant:

int solve(bool simp = false)
    {
        calls++;
        reset();
        lbool res = solveLimited(assumptions, simp);
        assumptions.clear();
        nomodel = (res != l_True);
        return (res == l_Undef) ? 0 : (res == l_True ? 10 : 20);
    }